

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::StreamArchive::decode_payload_uncompressed
          (StreamArchive *this,void *blob,size_t blob_size,Entry *entry,bool concurrent)

{
  bool bVar1;
  int iVar2;
  LogLevel LVar3;
  size_t sVar4;
  mz_ulong mVar5;
  ulong __n;
  uint32_t disk_crc;
  size_t read_size;
  undefined1 local_48 [8];
  ConditionalLockGuard holder;
  bool concurrent_local;
  Entry *entry_local;
  size_t blob_size_local;
  void *blob_local;
  StreamArchive *this_local;
  
  if (((entry->header).uncompressed_size == blob_size) &&
     ((entry->header).payload_size == blob_size)) {
    holder._15_1_ = concurrent;
    ConditionalLockGuard::ConditionalLockGuard
              ((ConditionalLockGuard *)local_48,&this->read_lock,concurrent);
    iVar2 = fseek((FILE *)this->file,entry->offset,0);
    if (iVar2 < 0) {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      __n = (ulong)(entry->header).payload_size;
      sVar4 = fread(blob,1,__n,(FILE *)this->file);
      if (sVar4 == __n) {
        bVar1 = false;
      }
      else {
        this_local._7_1_ = 0;
        bVar1 = true;
      }
    }
    ConditionalLockGuard::~ConditionalLockGuard((ConditionalLockGuard *)local_48);
    if (!bVar1) {
      if (((entry->header).crc == 0) ||
         (mVar5 = mz_crc32(0,(mz_uint8 *)blob,blob_size), (uint32_t)mVar5 == (entry->header).crc)) {
        this_local._7_1_ = 1;
      }
      else {
        LVar3 = get_thread_log_level();
        if (((int)LVar3 < 3) &&
           (bVar1 = Internal::log_thread_callback(LOG_ERROR,"CRC mismatch!\n"), !bVar1)) {
          fprintf(_stderr,"Fossilize ERROR: CRC mismatch!\n");
        }
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool decode_payload_uncompressed(void *blob, size_t blob_size, const Entry &entry, bool concurrent)
	{
		if (entry.header.uncompressed_size != blob_size || entry.header.payload_size != blob_size)
			return false;

		{
			ConditionalLockGuard holder(read_lock, concurrent);
			if (fseek(file, entry.offset, SEEK_SET) < 0)
				return false;

			size_t read_size = entry.header.payload_size;
			if (fread(blob, 1, read_size, file) != read_size)
				return false;
		}

		if (entry.header.crc != 0) // Verify checksum.
		{
			auto disk_crc = uint32_t(mz_crc32(MZ_CRC32_INIT, static_cast<unsigned char *>(blob), blob_size));
			if (disk_crc != entry.header.crc)
			{
				LOGE_LEVEL("CRC mismatch!\n");
				return false;
			}
		}

		return true;
	}